

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

bool double_conversion::DiyFpStrtod(Vector<const_char> buffer,int exponent,double *result)

{
  Vector<const_char> buffer_00;
  int32_t iVar1;
  int iVar2;
  int32_t iVar3;
  uint64_t uVar4;
  ulong uVar5;
  byte bVar6;
  double *in_RCX;
  int in_EDX;
  char *in_RDI;
  double dVar7;
  DiyFp DVar8;
  DiyFp rounded_input;
  uint64_t half_way;
  uint64_t precision_bits;
  uint64_t precision_bits_mask;
  uint64_t one64;
  int shift_amount;
  int precision_digits_count;
  int effective_significand_size;
  int order_of_magnitude;
  int fixed_error;
  int error_ab;
  int error_b;
  DiyFp adjustment_power;
  int adjustment_exponent;
  int cached_decimal_exponent;
  DiyFp cached_power;
  int old_e;
  uint64_t error;
  int kDenominator;
  int kDenominatorLog;
  int remaining_decimals;
  DiyFp input;
  uint64_t in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  DiyFp *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  int requested_exponent;
  int *in_stack_ffffffffffffff28;
  DiyFp *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  long lVar9;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_b8;
  DiyFp local_90;
  int local_80;
  int local_7c;
  DiyFp local_78;
  int32_t local_64;
  ulong local_60;
  undefined4 local_58;
  undefined4 local_54;
  char *local_50;
  int local_3c;
  DiyFp local_38;
  double *local_28;
  int local_1c;
  Vector<const_char> local_18;
  bool local_1;
  
  requested_exponent = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18.start_ = in_RDI;
  DiyFp::DiyFp(&local_38);
  local_50 = local_18.start_;
  buffer_00.length_ = in_stack_ffffffffffffff40;
  buffer_00.start_ = (char *)in_stack_ffffffffffffff38;
  buffer_00._12_4_ = in_stack_ffffffffffffff44;
  ReadDiyFp(buffer_00,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_54 = 3;
  local_58 = 8;
  local_1c = local_3c + local_1c;
  iVar2 = 4;
  if (local_3c == 0) {
    iVar2 = 0;
  }
  local_60 = (ulong)iVar2;
  local_64 = DiyFp::e(&local_38);
  DiyFp::Normalize(&local_38);
  iVar3 = local_64;
  iVar1 = DiyFp::e(&local_38);
  local_60 = local_60 << ((char)iVar3 - (char)iVar1 & 0x3fU);
  if (local_1c < -0x15c) {
    *local_28 = 0.0;
    local_1 = true;
  }
  else {
    DiyFp::DiyFp(&local_78);
    PowersOfTenCache::GetCachedPowerForDecimalExponent
              (requested_exponent,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (local_7c != local_1c) {
      local_80 = local_1c - local_7c;
      DVar8 = AdjustmentPowerOfTen(iVar3);
      local_90.f_ = DVar8.f_;
      local_90.e_ = DVar8.e_;
      DiyFp::Multiply(&local_38,&local_90);
      iVar2 = Vector<const_char>::length(&local_18);
      if (0x13 - iVar2 < local_80) {
        local_60 = local_60 + 4;
      }
    }
    DiyFp::Multiply(&local_38,&local_78);
    local_60 = (long)(int)((local_60 != 0) + 8) + local_60;
    local_64 = DiyFp::e(&local_38);
    DiyFp::Normalize(&local_38);
    iVar3 = local_64;
    iVar1 = DiyFp::e(&local_38);
    local_60 = local_60 << ((char)iVar3 - (char)iVar1 & 0x3fU);
    iVar3 = DiyFp::e(&local_38);
    iVar2 = Double::SignificandSizeForOrderOfMagnitude(iVar3 + 0x40);
    iVar2 = -iVar2;
    local_b8 = iVar2 + 0x40;
    if (0x3f < iVar2 + 0x43) {
      iVar2 = iVar2 + 4;
      uVar4 = DiyFp::f(&local_38);
      DiyFp::set_f(&local_38,uVar4 >> ((byte)iVar2 & 0x3f));
      iVar3 = DiyFp::e(&local_38);
      DiyFp::set_e(&local_38,iVar3 + iVar2);
      local_60 = (local_60 >> ((byte)iVar2 & 0x3f)) + 9;
      local_b8 = local_b8 - iVar2;
    }
    lVar9 = 1;
    bVar6 = (byte)local_b8;
    uVar5 = (1L << (bVar6 & 0x3f)) - 1;
    uVar4 = DiyFp::f(&local_38);
    uVar5 = (uVar4 & uVar5) << 3;
    lVar9 = (lVar9 << (bVar6 - 1 & 0x3f)) << 3;
    uVar4 = DiyFp::f(&local_38);
    iVar3 = DiyFp::e(&local_38);
    DiyFp::DiyFp((DiyFp *)&stack0xffffffffffffff10,uVar4 >> (bVar6 & 0x3f),iVar3 + local_b8);
    if (lVar9 + local_60 <= uVar5) {
      uVar4 = DiyFp::f((DiyFp *)&stack0xffffffffffffff10);
      DiyFp::set_f((DiyFp *)&stack0xffffffffffffff10,uVar4 + 1);
    }
    DVar8._8_8_ = in_stack_ffffffffffffff10;
    DVar8.f_ = in_stack_ffffffffffffff08;
    Double::Double((Double *)in_stack_ffffffffffffff18,DVar8);
    dVar7 = Double::value((Double *)0xae39c5);
    *local_28 = dVar7;
    if ((lVar9 - local_60 < uVar5) && (uVar5 < lVar9 + local_60)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool DiyFpStrtod(Vector<const char> buffer,
                        int exponent,
                        double* result) {
  DiyFp input;
  int remaining_decimals;
  ReadDiyFp(buffer, &input, &remaining_decimals);
  // Since we may have dropped some digits the input is not accurate.
  // If remaining_decimals is different than 0 than the error is at most
  // .5 ulp (unit in the last place).
  // We don't want to deal with fractions and therefore keep a common
  // denominator.
  const int kDenominatorLog = 3;
  const int kDenominator = 1 << kDenominatorLog;
  // Move the remaining decimals into the exponent.
  exponent += remaining_decimals;
  uint64_t error = (remaining_decimals == 0 ? 0 : kDenominator / 2);

  int old_e = input.e();
  input.Normalize();
  error <<= old_e - input.e();

  DOUBLE_CONVERSION_ASSERT(exponent <= PowersOfTenCache::kMaxDecimalExponent);
  if (exponent < PowersOfTenCache::kMinDecimalExponent) {
    *result = 0.0;
    return true;
  }
  DiyFp cached_power;
  int cached_decimal_exponent;
  PowersOfTenCache::GetCachedPowerForDecimalExponent(exponent,
                                                     &cached_power,
                                                     &cached_decimal_exponent);

  if (cached_decimal_exponent != exponent) {
    int adjustment_exponent = exponent - cached_decimal_exponent;
    DiyFp adjustment_power = AdjustmentPowerOfTen(adjustment_exponent);
    input.Multiply(adjustment_power);
    if (kMaxUint64DecimalDigits - buffer.length() >= adjustment_exponent) {
      // The product of input with the adjustment power fits into a 64 bit
      // integer.
      DOUBLE_CONVERSION_ASSERT(DiyFp::kSignificandSize == 64);
    } else {
      // The adjustment power is exact. There is hence only an error of 0.5.
      error += kDenominator / 2;
    }
  }

  input.Multiply(cached_power);
  // The error introduced by a multiplication of a*b equals
  //   error_a + error_b + error_a*error_b/2^64 + 0.5
  // Substituting a with 'input' and b with 'cached_power' we have
  //   error_b = 0.5  (all cached powers have an error of less than 0.5 ulp),
  //   error_ab = 0 or 1 / kDenominator > error_a*error_b/ 2^64
  int error_b = kDenominator / 2;
  int error_ab = (error == 0 ? 0 : 1);  // We round up to 1.
  int fixed_error = kDenominator / 2;
  error += error_b + error_ab + fixed_error;

  old_e = input.e();
  input.Normalize();
  error <<= old_e - input.e();

  // See if the double's significand changes if we add/subtract the error.
  int order_of_magnitude = DiyFp::kSignificandSize + input.e();
  int effective_significand_size =
      Double::SignificandSizeForOrderOfMagnitude(order_of_magnitude);
  int precision_digits_count =
      DiyFp::kSignificandSize - effective_significand_size;
  if (precision_digits_count + kDenominatorLog >= DiyFp::kSignificandSize) {
    // This can only happen for very small denormals. In this case the
    // half-way multiplied by the denominator exceeds the range of an uint64.
    // Simply shift everything to the right.
    int shift_amount = (precision_digits_count + kDenominatorLog) -
        DiyFp::kSignificandSize + 1;
    input.set_f(input.f() >> shift_amount);
    input.set_e(input.e() + shift_amount);
    // We add 1 for the lost precision of error, and kDenominator for
    // the lost precision of input.f().
    error = (error >> shift_amount) + 1 + kDenominator;
    precision_digits_count -= shift_amount;
  }
  // We use uint64_ts now. This only works if the DiyFp uses uint64_ts too.
  DOUBLE_CONVERSION_ASSERT(DiyFp::kSignificandSize == 64);
  DOUBLE_CONVERSION_ASSERT(precision_digits_count < 64);
  uint64_t one64 = 1;
  uint64_t precision_bits_mask = (one64 << precision_digits_count) - 1;
  uint64_t precision_bits = input.f() & precision_bits_mask;
  uint64_t half_way = one64 << (precision_digits_count - 1);
  precision_bits *= kDenominator;
  half_way *= kDenominator;
  DiyFp rounded_input(input.f() >> precision_digits_count,
                      input.e() + precision_digits_count);
  if (precision_bits >= half_way + error) {
    rounded_input.set_f(rounded_input.f() + 1);
  }
  // If the last_bits are too close to the half-way case than we are too
  // inaccurate and round down. In this case we return false so that we can
  // fall back to a more precise algorithm.

  *result = Double(rounded_input).value();
  if (half_way - error < precision_bits && precision_bits < half_way + error) {
    // Too imprecise. The caller will have to fall back to a slower version.
    // However the returned number is guaranteed to be either the correct
    // double, or the next-lower double.
    return false;
  } else {
    return true;
  }
}